

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall SimpleLoggerMgr::addCompElem(SimpleLoggerMgr *this,CompElem *elem)

{
  mutex_type *in_RDI;
  unique_lock<std::mutex> l_1;
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> *in_stack_ffffffffffffffc0;
  value_type *in_stack_ffffffffffffffc8;
  list<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>
  *in_stack_ffffffffffffffd0;
  
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffc0,in_RDI);
  std::__cxx11::list<SimpleLoggerMgr::CompElem_*,_std::allocator<SimpleLoggerMgr::CompElem_*>_>::
  push_back(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffc0);
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffc0,in_RDI);
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void SimpleLoggerMgr::addCompElem(SimpleLoggerMgr::CompElem* elem) {
    {   std::unique_lock<std::mutex> l(pendingCompElemsLock);
        pendingCompElems.push_back(elem);
    }
    {   std::unique_lock<std::mutex> l(cvCompressorLock);
        cvCompressor.notify_all();
    }
}